

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O0

int mbedtls_ripemd160_self_test(int verbose)

{
  uchar *input;
  int iVar1;
  size_t ilen;
  uchar local_28 [8];
  uchar output [20];
  int i;
  int verbose_local;
  
  output._16_4_ = verbose;
  memset(local_28,0,0x14);
  output[0xc] = '\0';
  output[0xd] = '\0';
  output[0xe] = '\0';
  output[0xf] = '\0';
  while( true ) {
    if (7 < (int)output._12_4_) {
      if (output._16_4_ != 0) {
        printf(anon_var_dwarf_7cb3 + 8);
      }
      return 0;
    }
    if (output._16_4_ != 0) {
      printf("  RIPEMD-160 test #%d: ",(ulong)(output._12_4_ + 1));
    }
    input = (uchar *)ripemd160_test_input[(int)output._12_4_];
    ilen = strlen(ripemd160_test_input[(int)output._12_4_]);
    mbedtls_ripemd160(input,ilen,local_28);
    iVar1 = memcmp(local_28,ripemd160_test_md + (int)output._12_4_,0x14);
    if (iVar1 != 0) break;
    if (output._16_4_ != 0) {
      printf("passed\n");
    }
    output._12_4_ = output._12_4_ + 1;
  }
  if (output._16_4_ != 0) {
    printf("failed\n");
  }
  return 1;
}

Assistant:

int mbedtls_ripemd160_self_test( int verbose )
{
    int i;
    unsigned char output[20];

    memset( output, 0, sizeof output );

    for( i = 0; i < TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  RIPEMD-160 test #%d: ", i + 1 );

        mbedtls_ripemd160( (const unsigned char *) ripemd160_test_input[i],
                   strlen( ripemd160_test_input[i] ),
                   output );

        if( memcmp( output, ripemd160_test_md[i], 20 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}